

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx2.cpp
# Opt level: O3

int __thiscall
ncnn::BinaryOp_x86_avx2::forward_inplace(BinaryOp_x86_avx2 *this,Mat *bottom_top_blob,Option *opt)

{
  undefined4 uVar1;
  _func_int *p_Var2;
  __m256 afVar3;
  int iVar4;
  long lVar5;
  int iVar6;
  __m256 *pafVar7;
  undefined1 (*pauVar8) [32];
  undefined1 (*pauVar9) [16];
  int iVar10;
  undefined1 auVar12 [16];
  float fVar11;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar23 [56];
  undefined1 auVar22 [64];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 in_ZMM1 [64];
  undefined1 auVar28 [64];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 in_ZMM3 [64];
  undefined1 auVar31 [64];
  __m128 afVar32;
  binary_op_pow_pack8 op;
  __m256 _b;
  binary_op_pow_pack8 local_bd;
  int local_bc;
  long local_b8;
  long local_b0;
  Mat *local_a8;
  __m256 local_a0;
  __m256 local_80 [2];
  
  afVar3 = local_80[0];
  p_Var2 = this->_vptr_BinaryOp_x86_avx2[-3];
  local_a8 = bottom_top_blob;
  if (bottom_top_blob->elempack == 4) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar24._0_4_ = fVar11 + *(float *)*pauVar9;
              auVar24._4_4_ = fVar11 + *(float *)((long)*pauVar9 + 4);
              auVar24._8_4_ = fVar11 + *(float *)((long)*pauVar9 + 8);
              auVar24._12_4_ = fVar11 + *(float *)((long)*pauVar9 + 0xc);
              *pauVar9 = auVar24;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 1:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar14._4_4_ = uVar1;
        auVar14._0_4_ = uVar1;
        auVar14._8_4_ = uVar1;
        auVar14._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar16 = vsubps_avx(*pauVar9,auVar14);
              *pauVar9 = auVar16;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 2:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar25._0_4_ = fVar11 * *(float *)*pauVar9;
              auVar25._4_4_ = fVar11 * *(float *)((long)*pauVar9 + 4);
              auVar25._8_4_ = fVar11 * *(float *)((long)*pauVar9 + 8);
              auVar25._12_4_ = fVar11 * *(float *)((long)*pauVar9 + 0xc);
              *pauVar9 = auVar25;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 3:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar26._0_4_ = fVar11 * *(float *)*pauVar9;
              auVar26._4_4_ = fVar11 * *(float *)((long)*pauVar9 + 4);
              auVar26._8_4_ = fVar11 * *(float *)((long)*pauVar9 + 8);
              auVar26._12_4_ = fVar11 * *(float *)((long)*pauVar9 + 0xc);
              *pauVar9 = auVar26;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 4:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar12._4_4_ = uVar1;
        auVar12._0_4_ = uVar1;
        auVar12._8_4_ = uVar1;
        auVar12._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar16 = vmaxps_avx(auVar12,*pauVar9);
              *pauVar9 = auVar16;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 5:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar15._4_4_ = uVar1;
        auVar15._0_4_ = uVar1;
        auVar15._8_4_ = uVar1;
        auVar15._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar16 = vminps_avx(auVar15,*pauVar9);
              *pauVar9 = auVar16;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 6:
      local_80[0][1] = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][0] = local_80[0][1];
      local_80[0][2] = local_80[0][1];
      local_80[0][3] = local_80[0][1];
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      local_80[0]._16_16_ = afVar3._16_16_;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pauVar9 = (undefined1 (*) [16])
                      (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar4 = local_bc;
            do {
              auVar23 = ZEXT856(*(ulong *)(*pauVar9 + 8));
              local_a0._0_16_ = *pauVar9;
              afVar32 = binary_op_pow_pack4::operator()
                                  ((binary_op_pow_pack4 *)&local_bd,(__m128 *)local_a0,
                                   (__m128 *)local_80);
              auVar22._0_8_ = afVar32._0_8_;
              auVar22._8_56_ = auVar23;
              *pauVar9 = auVar22._0_16_;
              pauVar9 = pauVar9 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar13._4_4_ = uVar1;
        auVar13._0_4_ = uVar1;
        auVar13._8_4_ = uVar1;
        auVar13._12_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar16 = vsubps_avx(auVar13,*pauVar9);
              *pauVar9 = auVar16;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 8:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar16._4_4_ = fVar11;
        auVar16._0_4_ = fVar11;
        auVar16._8_4_ = fVar11;
        auVar16._12_4_ = fVar11;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar9 = (undefined1 (*) [16])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar13 = vrcpps_avx(*pauVar9);
              auVar30._0_4_ = fVar11 * auVar13._0_4_;
              auVar30._4_4_ = fVar11 * auVar13._4_4_;
              auVar30._8_4_ = fVar11 * auVar13._8_4_;
              auVar30._12_4_ = fVar11 * auVar13._12_4_;
              auVar15 = vfmsub213ps_fma(*pauVar9,auVar30,auVar16);
              auVar13 = vfnmadd213ps_fma(auVar15,auVar13,auVar30);
              *pauVar9 = auVar13;
              pauVar9 = pauVar9 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    default:
      goto switchD_00258c44_default;
    }
    goto LAB_00259355;
  }
  if (bottom_top_blob->elempack == 8) {
    switch(*(undefined4 *)(&this->field_0xd0 + (long)p_Var2)) {
    case 0:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar27._0_4_ = fVar11 + *(float *)*pauVar8;
              auVar27._4_4_ = fVar11 + *(float *)((long)*pauVar8 + 4);
              auVar27._8_4_ = fVar11 + *(float *)((long)*pauVar8 + 8);
              auVar27._12_4_ = fVar11 + *(float *)((long)*pauVar8 + 0xc);
              auVar27._16_4_ = fVar11 + *(float *)((long)*pauVar8 + 0x10);
              auVar27._20_4_ = fVar11 + *(float *)((long)*pauVar8 + 0x14);
              auVar27._24_4_ = fVar11 + *(float *)((long)*pauVar8 + 0x18);
              auVar27._28_4_ = fVar11 + *(float *)((long)*pauVar8 + 0x1c);
              *pauVar8 = auVar27;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 1:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar19._4_4_ = uVar1;
        auVar19._0_4_ = uVar1;
        auVar19._8_4_ = uVar1;
        auVar19._12_4_ = uVar1;
        auVar19._16_4_ = uVar1;
        auVar19._20_4_ = uVar1;
        auVar19._24_4_ = uVar1;
        auVar19._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar21 = vsubps_avx(*pauVar8,auVar19);
              *pauVar8 = auVar21;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 2:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar28._0_4_ = fVar11 * *(float *)*pauVar8;
              auVar28._4_4_ = fVar11 * *(float *)((long)*pauVar8 + 4);
              auVar28._8_4_ = fVar11 * *(float *)((long)*pauVar8 + 8);
              auVar28._12_4_ = fVar11 * *(float *)((long)*pauVar8 + 0xc);
              auVar28._16_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x10);
              auVar28._20_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x14);
              auVar28._28_36_ = in_ZMM1._28_36_;
              auVar28._24_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x18);
              in_ZMM1 = ZEXT3264(auVar28._0_32_);
              *pauVar8 = auVar28._0_32_;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 3:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = 1.0 / *(float *)(&this->field_0xd8 + (long)p_Var2);
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar29._0_4_ = fVar11 * *(float *)*pauVar8;
              auVar29._4_4_ = fVar11 * *(float *)((long)*pauVar8 + 4);
              auVar29._8_4_ = fVar11 * *(float *)((long)*pauVar8 + 8);
              auVar29._12_4_ = fVar11 * *(float *)((long)*pauVar8 + 0xc);
              auVar29._16_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x10);
              auVar29._20_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x14);
              auVar29._28_36_ = in_ZMM1._28_36_;
              auVar29._24_4_ = fVar11 * *(float *)((long)*pauVar8 + 0x18);
              in_ZMM1 = ZEXT3264(auVar29._0_32_);
              *pauVar8 = auVar29._0_32_;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 4:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar17._4_4_ = uVar1;
        auVar17._0_4_ = uVar1;
        auVar17._8_4_ = uVar1;
        auVar17._12_4_ = uVar1;
        auVar17._16_4_ = uVar1;
        auVar17._20_4_ = uVar1;
        auVar17._24_4_ = uVar1;
        auVar17._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar21 = vmaxps_avx(auVar17,*pauVar8);
              *pauVar8 = auVar21;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 5:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar20._4_4_ = uVar1;
        auVar20._0_4_ = uVar1;
        auVar20._8_4_ = uVar1;
        auVar20._12_4_ = uVar1;
        auVar20._16_4_ = uVar1;
        auVar20._20_4_ = uVar1;
        auVar20._24_4_ = uVar1;
        auVar20._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar21 = vminps_avx(auVar20,*pauVar8);
              *pauVar8 = auVar21;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 6:
      fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
      local_80[0][1] = fVar11;
      local_80[0][0] = fVar11;
      local_80[0][2] = fVar11;
      local_80[0][3] = fVar11;
      local_80[0][4] = fVar11;
      local_80[0][5] = fVar11;
      local_80[0][6] = fVar11;
      local_80[0][7] = fVar11;
      local_b0 = (long)bottom_top_blob->c;
      local_bc = bottom_top_blob->h * bottom_top_blob->w;
      if (0 < local_b0) {
        local_b8 = 0;
        do {
          if (0 < local_bc) {
            pafVar7 = (__m256 *)
                      (local_a8->cstep * local_b8 * local_a8->elemsize + (long)local_a8->data);
            iVar4 = local_bc;
            do {
              local_a0 = *pafVar7;
              binary_op_pow_pack8::operator()(&local_bd,&local_a0,local_80);
              *pafVar7 = local_a0;
              pafVar7 = pafVar7 + 1;
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
          }
          local_b8 = local_b8 + 1;
        } while (local_b8 != local_b0);
      }
      break;
    case 7:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        uVar1 = *(undefined4 *)(&this->field_0xd8 + (long)p_Var2);
        auVar18._4_4_ = uVar1;
        auVar18._0_4_ = uVar1;
        auVar18._8_4_ = uVar1;
        auVar18._12_4_ = uVar1;
        auVar18._16_4_ = uVar1;
        auVar18._20_4_ = uVar1;
        auVar18._24_4_ = uVar1;
        auVar18._28_4_ = uVar1;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar21 = vsubps_avx(auVar18,*pauVar8);
              *pauVar8 = auVar21;
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    case 8:
      iVar4 = bottom_top_blob->c;
      if (0 < (long)iVar4) {
        iVar6 = bottom_top_blob->h * bottom_top_blob->w;
        fVar11 = *(float *)(&this->field_0xd8 + (long)p_Var2);
        auVar21._4_4_ = fVar11;
        auVar21._0_4_ = fVar11;
        auVar21._8_4_ = fVar11;
        auVar21._12_4_ = fVar11;
        auVar21._16_4_ = fVar11;
        auVar21._20_4_ = fVar11;
        auVar21._24_4_ = fVar11;
        auVar21._28_4_ = fVar11;
        lVar5 = 0;
        do {
          if (0 < iVar6) {
            pauVar8 = (undefined1 (*) [32])
                      (bottom_top_blob->cstep * lVar5 * bottom_top_blob->elemsize +
                      (long)bottom_top_blob->data);
            iVar10 = iVar6;
            do {
              auVar18 = vrcpps_avx(*pauVar8);
              auVar31._0_4_ = fVar11 * auVar18._0_4_;
              auVar31._4_4_ = fVar11 * auVar18._4_4_;
              auVar31._8_4_ = fVar11 * auVar18._8_4_;
              auVar31._12_4_ = fVar11 * auVar18._12_4_;
              auVar31._16_4_ = fVar11 * auVar18._16_4_;
              auVar31._20_4_ = fVar11 * auVar18._20_4_;
              auVar31._28_36_ = in_ZMM3._28_36_;
              auVar31._24_4_ = fVar11 * auVar18._24_4_;
              auVar20 = auVar31._0_32_;
              in_ZMM3 = ZEXT3264(auVar20);
              auVar16 = vfmsub213ps_fma(*pauVar8,auVar20,auVar21);
              auVar16 = vfnmadd213ps_fma(ZEXT1632(auVar16),auVar18,auVar20);
              *pauVar8 = ZEXT1632(auVar16);
              pauVar8 = pauVar8 + 1;
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != iVar4);
      }
      break;
    default:
      goto switchD_00258c44_default;
    }
LAB_00259355:
    iVar4 = 0;
  }
  else {
switchD_00258c44_default:
    iVar4 = BinaryOp::forward_inplace
                      ((BinaryOp *)((long)&this->_vptr_BinaryOp_x86_avx2 + (long)p_Var2),
                       bottom_top_blob,opt);
  }
  return iVar4;
}

Assistant:

int BinaryOp_x86_avx2::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
#if __SSE2__
    int elempack = bottom_top_blob.elempack;

#if __AVX__
    if (elempack == 8)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack8<binary_op_add_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack8<binary_op_sub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack8<binary_op_mul_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack8<binary_op_div_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack8<binary_op_max_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack8<binary_op_min_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack8<binary_op_pow_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack8<binary_op_rsub_pack8>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack8<binary_op_rdiv_pack8>(bottom_top_blob, b, opt);
    }
#endif // __AVX__

    if (elempack == 4)
    {
        if (op_type == Operation_ADD)
            return binary_op_scalar_inplace_pack4<binary_op_add_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_SUB)
            return binary_op_scalar_inplace_pack4<binary_op_sub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MUL)
            return binary_op_scalar_inplace_pack4<binary_op_mul_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_DIV)
            return binary_op_scalar_inplace_pack4<binary_op_div_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MAX)
            return binary_op_scalar_inplace_pack4<binary_op_max_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_MIN)
            return binary_op_scalar_inplace_pack4<binary_op_min_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_POW)
            return binary_op_scalar_inplace_pack4<binary_op_pow_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RSUB)
            return binary_op_scalar_inplace_pack4<binary_op_rsub_pack4>(bottom_top_blob, b, opt);

        if (op_type == Operation_RDIV)
            return binary_op_scalar_inplace_pack4<binary_op_rdiv_pack4>(bottom_top_blob, b, opt);
    }
#endif // __SSE2__

    return BinaryOp::forward_inplace(bottom_top_blob, opt);
}